

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void Rule_setExpression(Node *node,Node *expression)

{
  int iVar1;
  Node *expression_local;
  Node *node_local;
  
  if (node == (Node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                  ,0x59,"void Rule_setExpression(Node *, Node *)");
  }
  if (node->type == 1) {
    (node->rule).expression = expression;
    if ((start != (Node *)0x0) && (iVar1 = strcmp((node->rule).name,"start"), iVar1 != 0)) {
      return;
    }
    start = node;
    return;
  }
  __assert_fail("Rule == node->type",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                ,0x5d,"void Rule_setExpression(Node *, Node *)");
}

Assistant:

void Rule_setExpression(Node *node, Node *expression)
{
  assert(node);
#ifdef DEBUG
  Node_print(node);  fprintf(stderr, " [%d]<- ", node->type);  Node_print(expression);  fprintf(stderr, "\n");
#endif
  assert(Rule == node->type);
  node->rule.expression= expression;
  if (!start || !strcmp(node->rule.name, "start"))
    start= node;
}